

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O1

CURLcode Curl_urldecode(char *string,size_t length,char **ostring,size_t *olen,urlreject ctrl)

{
  byte bVar1;
  CURLcode CVar2;
  char *pcVar3;
  ulong uVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  char hexstr [3];
  char *ptr;
  byte local_4b;
  byte local_4a;
  undefined1 local_49;
  char **local_48;
  size_t *local_40;
  char *local_38;
  
  local_40 = olen;
  if (length == 0) {
    length = strlen(string);
  }
  pcVar3 = (char *)(*Curl_cmalloc)(length + 1);
  if (pcVar3 == (char *)0x0) {
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
  else {
    sVar6 = 0;
    sVar7 = length + 1;
    local_48 = ostring;
    do {
      uVar4 = sVar7 - 1;
      if (uVar4 == 0) {
        pcVar3[sVar6] = '\0';
        if (local_40 != (size_t *)0x0) {
          *local_40 = sVar6;
        }
        *local_48 = pcVar3;
        return CURLE_OK;
      }
      bVar1 = *string;
      if ((((2 < uVar4) && (bVar1 == 0x25)) &&
          (((byte)(((byte *)string)[1] - 0x30) < 10 ||
           ((uVar5 = ((byte *)string)[1] - 0x41, uVar5 < 0x26 &&
            ((0x3f0000003fU >> ((ulong)uVar5 & 0x3f) & 1) != 0)))))) &&
         (((byte)(((byte *)string)[2] - 0x30) < 10 ||
          ((uVar5 = ((byte *)string)[2] - 0x41, uVar5 < 0x26 &&
           ((0x3f0000003fU >> ((ulong)uVar5 & 0x3f) & 1) != 0)))))) {
        local_4b = ((byte *)string)[1];
        local_4a = ((byte *)string)[2];
        local_49 = 0;
        uVar4 = strtoul((char *)&local_4b,&local_38,0x10);
        bVar1 = curlx_ultouc(uVar4);
        uVar4 = sVar7 - 3;
        string = (char *)((byte *)string + 2);
      }
      if ((bVar1 != 0 || ctrl != REJECT_ZERO) && (0x1f < bVar1 || ctrl != REJECT_CTRL)) {
        pcVar3[sVar6] = bVar1;
        sVar6 = sVar6 + 1;
        string = (char *)((byte *)string + 1);
      }
      else {
        (*Curl_cfree)(pcVar3);
      }
      sVar7 = uVar4;
    } while ((bVar1 != 0 || ctrl != REJECT_ZERO) && (0x1f < bVar1 || ctrl != REJECT_CTRL));
    CVar2 = CURLE_URL_MALFORMAT;
  }
  return CVar2;
}

Assistant:

CURLcode Curl_urldecode(const char *string, size_t length,
                        char **ostring, size_t *olen,
                        enum urlreject ctrl)
{
  size_t alloc;
  char *ns;
  size_t strindex = 0;
  unsigned long hex;

  DEBUGASSERT(string);
  DEBUGASSERT(ctrl >= REJECT_NADA); /* crash on TRUE/FALSE */

  alloc = (length?length:strlen(string)) + 1;
  ns = malloc(alloc);

  if(!ns)
    return CURLE_OUT_OF_MEMORY;

  while(--alloc > 0) {
    unsigned char in = *string;
    if(('%' == in) && (alloc > 2) &&
       ISXDIGIT(string[1]) && ISXDIGIT(string[2])) {
      /* this is two hexadecimal digits following a '%' */
      char hexstr[3];
      char *ptr;
      hexstr[0] = string[1];
      hexstr[1] = string[2];
      hexstr[2] = 0;

      hex = strtoul(hexstr, &ptr, 16);

      in = curlx_ultouc(hex); /* this long is never bigger than 255 anyway */

      string += 2;
      alloc -= 2;
    }

    if(((ctrl == REJECT_CTRL) && (in < 0x20)) ||
       ((ctrl == REJECT_ZERO) && (in == 0))) {
      free(ns);
      return CURLE_URL_MALFORMAT;
    }

    ns[strindex++] = in;
    string++;
  }
  ns[strindex] = 0; /* terminate it */

  if(olen)
    /* store output size */
    *olen = strindex;

  /* store output string */
  *ostring = ns;

  return CURLE_OK;
}